

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

bool __thiscall xray_re::xr_mesh_builder::b_face::is_duplicate(b_face *this,b_face *face)

{
  long lVar1;
  uint uVar2;
  ulong uVar4;
  ulong uVar3;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 3) {
      return false;
    }
    if ((this->field_0).__refs[lVar1] == (face->field_0).field_0.v[0]) break;
    lVar1 = lVar1 + 1;
  }
  uVar2 = 1 << ((byte)lVar1 & 0x1f) & 3;
  uVar3 = (ulong)uVar2;
  if ((this->field_0).__refs[uVar3] != (face->field_0).field_0.v[1]) {
    return false;
  }
  uVar4 = (ulong)(1 << (sbyte)uVar2 & 3);
  if ((this->field_0).__refs[uVar4] != (face->field_0).field_0.v[2]) {
    return false;
  }
  if (this->sector != face->sector) {
    return false;
  }
  if (this->field_1 != face->field_1) {
    return false;
  }
  if (*(uint32_t *)((long)&this->field_0 + lVar1 * 4 + 0xc) != (face->field_0).field_0.n[0]) {
    return false;
  }
  if (*(uint32_t *)((long)&this->field_0 + uVar3 * 4 + 0xc) != (face->field_0).field_0.n[1]) {
    return false;
  }
  if (*(uint32_t *)((long)&this->field_0 + uVar4 * 4 + 0xc) != (face->field_0).field_0.n[2]) {
    return false;
  }
  if (*(uint32_t *)((long)&this->field_0 + lVar1 * 4 + 0x18) != (face->field_0).field_0.tc[0]) {
    return false;
  }
  if (*(uint32_t *)((long)&this->field_0 + uVar3 * 4 + 0x18) != (face->field_0).field_0.tc[1]) {
    return false;
  }
  return *(uint32_t *)((long)&this->field_0 + uVar4 * 4 + 0x18) == (face->field_0).field_0.tc[2];
}

Assistant:

bool xr_mesh_builder::b_face::is_duplicate(const b_face& face) const
{
	for (uint_fast32_t i0 = 0; i0 != 3; ++i0) {
		if (v[i0] != face.v0)
			continue;
		uint_fast32_t i1 = (1 << i0) & 3;
		uint_fast32_t i2 = (1 << i1) & 3;
		return v[i1] == face.v1 && v[i2] == face.v2 &&
				sector == face.sector && surface == face.surface &&
				n[i0] == face.n0 && n[i1] == face.n1 && n[i2] == face.n2 &&
				tc[i0] == face.tc0 && tc[i1] == face.tc1 && tc[i2] == face.tc2;
	}
	return false;
}